

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase
          (GeometryShaderRenderingTrianglesCase *this,Context *context,ExtParameters *extParams,
          char *name,bool use_adjacency_data,GLenum drawcall_mode,_shader_output_type output_type)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  TestError *pTVar5;
  float *pfVar6;
  uchar *puVar7;
  uint *puVar8;
  uint *puVar9;
  ulong uVar10;
  float **ppfVar11;
  long lVar12;
  undefined7 in_register_00000081;
  float **ppfVar13;
  uchar uVar14;
  ulong uVar15;
  uchar **ppuVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint whole_rt_height;
  uint single_rt_height;
  uint rendertarget_width;
  uint rendertarget_height;
  int raw_array_indices [24];
  uint whole_rt_width;
  uint single_rt_width;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_coordinates;
  float local_164;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  Vector<float,_4> local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  uint *local_e0;
  float local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  void *local_c8;
  undefined8 uStack_c0;
  long local_b8;
  uint *local_a8;
  uchar **local_a0;
  uint *local_98;
  float **local_90;
  uint *local_88;
  float **local_80;
  uint *local_78;
  uchar **local_70;
  uint *local_68;
  float **local_60;
  uint *local_58;
  float **local_50;
  ulong local_48;
  uint *local_40;
  uint *local_38;
  
  TestCaseBase::TestCaseBase
            ((TestCaseBase *)this,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).m_context = context;
  (this->super_GeometryShaderRenderingCase).m_instanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_gs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_po_id = 0;
  (this->super_GeometryShaderRenderingCase).m_renderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_singleRenderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_vao_id = 0;
  (this->super_GeometryShaderRenderingCase).m_vs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_to_id = 0;
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingTrianglesCase_0214cf90;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  this->m_drawcall_mode = drawcall_mode;
  this->m_use_adjacency_data = use_adjacency_data;
  this->m_raw_array_instanced_data = (float *)0x0;
  this->m_raw_array_instanced_data_size = 0;
  this->m_raw_array_noninstanced_data = (float *)0x0;
  this->m_raw_array_noninstanced_data_size = 0;
  this->m_unordered_array_instanced_data = (float *)0x0;
  this->m_unordered_array_instanced_data_size = 0;
  this->m_unordered_array_noninstanced_data = (float *)0x0;
  this->m_unordered_array_noninstanced_data_size = 0;
  this->m_unordered_elements_instanced_data = (uchar *)0x0;
  this->m_unordered_elements_instanced_data_size = 0;
  this->m_unordered_elements_noninstanced_data = (uchar *)0x0;
  this->m_unordered_elements_noninstanced_data_size = 0;
  this->m_unordered_elements_max_index = '\x18';
  this->m_unordered_elements_min_index = '\0';
  if ((int)CONCAT71(in_register_00000081,use_adjacency_data) == 0) {
    if (drawcall_mode - 7 < 0xfffffffd) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,
                 "Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for \'triangles\' geometry shader input layout qualifier test implementation"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeeb);
      goto LAB_00d2416d;
    }
  }
  else if (drawcall_mode - 0xe < 0xfffffffe) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported for \'triangles_adjacency\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xef3);
    goto LAB_00d2416d;
  }
  local_80 = &this->m_raw_array_instanced_data;
  local_88 = &this->m_raw_array_instanced_data_size;
  local_50 = &this->m_raw_array_noninstanced_data;
  local_58 = &this->m_raw_array_noninstanced_data_size;
  local_90 = &this->m_unordered_array_instanced_data;
  local_98 = &this->m_unordered_array_instanced_data_size;
  local_60 = &this->m_unordered_array_noninstanced_data;
  local_68 = &this->m_unordered_array_noninstanced_data_size;
  local_a0 = &this->m_unordered_elements_instanced_data;
  local_a8 = &this->m_unordered_elements_instanced_data_size;
  local_70 = &this->m_unordered_elements_noninstanced_data;
  local_78 = &this->m_unordered_elements_noninstanced_data_size;
  if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
    fVar17 = 0.0;
    if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      fVar17 = 1.5;
    }
    uVar15 = 0;
    do {
      local_14c = 0;
      local_150 = 0;
      uVar3 = 1;
      local_e0 = local_58;
      puVar8 = local_78;
      puVar9 = local_68;
      ppfVar11 = local_60;
      ppfVar13 = local_50;
      ppuVar16 = local_70;
      if ((int)uVar15 != 0) {
        uVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode._vptr_TestNode[5])(this);
        local_e0 = local_88;
        puVar8 = local_a8;
        puVar9 = local_98;
        ppfVar11 = local_90;
        ppfVar13 = local_80;
        ppuVar16 = local_a0;
      }
      local_40 = puVar8;
      local_38 = puVar9;
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,(ulong)uVar3,&local_150,&local_14c);
      uVar10 = (ulong)local_150;
      local_e8 = (ulong)local_14c;
      local_154 = 0;
      local_cc = 0;
      local_d0 = 0;
      local_158 = 0;
      iVar4 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[7])(this);
      *local_e0 = iVar4 << 4;
      pfVar6 = (float *)operator_new__((ulong)(uint)(iVar4 << 4));
      *ppfVar13 = pfVar6;
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,1,&local_cc,&local_154);
      uVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[5])(this);
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,(ulong)uVar3,&local_d0,&local_158);
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      local_b8 = 0;
      if ((int)uVar15 == 0) {
        fVar18 = 0.0;
        local_164 = 1.0;
      }
      else {
        local_164 = (float)local_154 / (float)local_158 + (float)local_154 / (float)local_158 + -1.0
        ;
        fVar18 = (local_164 + 1.0) * 0.5 + -1.0;
      }
      local_148.m_data._0_8_ = (ulong)(uint)fVar18 << 0x20;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 1.0;
      local_48 = uVar15;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_c8,
                 &local_148);
      local_d4 = (2.0 / (float)uVar10) * fVar17;
      local_148.m_data[1] = fVar18;
      local_148.m_data[0] = local_d4 + -1.0;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_c8,
                 &local_148);
      fVar19 = (2.0 / (float)(long)local_e8) * fVar17;
      local_e8 = CONCAT44(local_e8._4_4_,fVar19);
      local_148.m_data._0_8_ = (ulong)(uint)(fVar19 + -1.0) << 0x20;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_c8,
                 &local_148);
      local_148.m_data[0] = 1.0 - local_d4;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_c8,
                 &local_148);
      local_148.m_data._0_8_ = (ulong)(uint)(local_164 - (float)local_e8) << 0x20;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_c8,
                 &local_148);
      pfVar6 = *ppfVar13;
      local_f8 = 0xffffffffffffffff;
      uStack_f0 = 0xffffffffffffffff;
      local_108 = 0xffffffffffffffff;
      uStack_100 = 0xffffffffffffffff;
      local_118 = 0xffffffffffffffff;
      uStack_110 = 0xffffffffffffffff;
      local_128 = 0xffffffffffffffff;
      uStack_120 = 0xffffffffffffffff;
      local_138 = 0xffffffffffffffff;
      uStack_130 = 0xffffffffffffffff;
      local_148.m_data[0] = -NAN;
      local_148.m_data[1] = -NAN;
      local_148.m_data[2] = -NAN;
      local_148.m_data[3] = -NAN;
      switch(this->m_drawcall_mode) {
      case 4:
        local_148.m_data[0] = 0.0;
        local_148.m_data[1] = 1.4013e-45;
        local_148.m_data[2] = 2.8026e-45;
        local_148.m_data[3] = 0.0;
        local_138 = 0x300000002;
        uStack_130 = 0x300000000;
        local_128 = 4;
        uStack_120 = 0x100000004;
        uVar15 = 0xc;
        break;
      case 5:
        local_148.m_data[0] = 1.4013e-45;
        local_148.m_data[1] = 0.0;
        local_148.m_data[2] = 2.8026e-45;
        local_148.m_data[3] = 4.2039e-45;
        local_138 = 0x400000000;
        uStack_130 = 0xffffffff00000001;
        uVar15 = 7;
        break;
      case 6:
        local_148.m_data[0] = 0.0;
        local_148.m_data[1] = 1.4013e-45;
        local_148.m_data[2] = 2.8026e-45;
        local_148.m_data[3] = 4.2039e-45;
        local_138 = 0x100000004;
        uVar15 = 6;
        break;
      default:
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unsupported draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xff2);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0xc:
        local_148.m_data[0] = 0.0;
        local_148.m_data[1] = 0.0;
        local_148.m_data[2] = 1.4013e-45;
        local_148.m_data[3] = 0.0;
        local_138 = 2;
        uStack_130 = 0;
        local_128 = 2;
        uStack_120 = 3;
        local_118 = 0;
        uStack_110 = 3;
        local_108 = 4;
        uStack_100 = 0;
        local_f8 = 4;
        uStack_f0 = 1;
        uVar15 = 0x18;
        break;
      case 0xd:
        local_148.m_data[0] = 1.4013e-45;
        local_148.m_data[1] = 0.0;
        local_148.m_data[2] = 0.0;
        local_148.m_data[3] = 0.0;
        local_138 = 2;
        uStack_130 = 3;
        local_128 = 0;
        uStack_120 = 4;
        local_118 = 1;
        uVar15 = 0xe;
      }
      uVar10 = 0;
      do {
        if ((long)(int)local_148.m_data[uVar10] != -1) {
          lVar12 = (long)(int)local_148.m_data[uVar10] * 0x10;
          *pfVar6 = *(float *)((long)local_c8 + lVar12);
          pfVar6[1] = *(float *)((long)local_c8 + lVar12 + 4);
          pfVar6[2] = *(float *)((long)local_c8 + lVar12 + 8);
          pfVar6[3] = *(float *)((long)local_c8 + lVar12 + 0xc);
          pfVar6 = pfVar6 + 4;
        }
        uVar10 = uVar10 + 1;
      } while (uVar15 != uVar10);
      uVar3 = *local_e0;
      *local_38 = uVar3;
      pfVar6 = (float *)operator_new__((ulong)uVar3 << 2);
      *ppfVar11 = pfVar6;
      *local_40 = (uint)uVar15;
      puVar7 = (uchar *)operator_new__(uVar15);
      *ppuVar16 = puVar7;
      uVar10 = (ulong)((uint)uVar15 << 4);
      lVar12 = 0;
      do {
        uVar2 = ((undefined8 *)((long)*ppfVar13 + lVar12))[1];
        puVar1 = (undefined8 *)((long)*ppfVar11 + (uVar10 - 0x10));
        *puVar1 = *(undefined8 *)((long)*ppfVar13 + lVar12);
        puVar1[1] = uVar2;
        lVar12 = lVar12 + 0x10;
        uVar10 = uVar10 - 0x10;
      } while (uVar10 != 0);
      uVar14 = (uchar)uVar15;
      uVar10 = 0;
      do {
        uVar14 = uVar14 + 0xff;
        (*ppuVar16)[uVar10] = uVar14;
        uVar10 = uVar10 + 1;
      } while (uVar15 != uVar10);
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8,local_b8 - (long)local_c8);
      }
      uVar15 = (ulong)((int)local_48 + 1);
    } while ((int)local_48 == 0);
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,
             "Unsupported output layout qualifier type requested for \'triangles\' geometry shader input layout qualifier test implementation"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xefb);
LAB_00d2416d:
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, bool use_adjacency_data,
																		   glw::GLenum		   drawcall_mode,
																		   _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
	, m_drawcall_mode(drawcall_mode)
	, m_use_adjacency_data(use_adjacency_data)
	, m_raw_array_instanced_data(0)
	, m_raw_array_instanced_data_size(0)
	, m_raw_array_noninstanced_data(0)
	, m_raw_array_noninstanced_data_size(0)
	, m_unordered_array_instanced_data(0)
	, m_unordered_array_instanced_data_size(0)
	, m_unordered_array_noninstanced_data(0)
	, m_unordered_array_noninstanced_data_size(0)
	, m_unordered_elements_instanced_data(0)
	, m_unordered_elements_instanced_data_size(0)
	, m_unordered_elements_noninstanced_data(0)
	, m_unordered_elements_noninstanced_data_size(0)
	, m_unordered_elements_max_index(24) /* maximum amount of vertices generated by this test case */
	, m_unordered_elements_min_index(0)
{
	/* Sanity checks */
	if (!m_use_adjacency_data)
	{
		if (drawcall_mode != GL_TRIANGLES && drawcall_mode != GL_TRIANGLE_STRIP && drawcall_mode != GL_TRIANGLE_FAN)
		{
			TCU_FAIL("Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for "
					 "'triangles' geometry shader input layout qualifier test implementation");
		}
	}
	else
	{
		if (drawcall_mode != GL_TRIANGLES_ADJACENCY_EXT && drawcall_mode != GL_TRIANGLE_STRIP_ADJACENCY_EXT)
		{
			TCU_FAIL("Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported "
					 "for 'triangles_adjacency' geometry shader input layout qualifier test implementation");
		}
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'triangles' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Generate data in two flavors - one for non-instanced case, the other one for instanced case */
	for (int n_case = 0; n_case < 2 /* cases */; ++n_case)
	{
		bool			is_instanced					 = (n_case != 0);
		int				n_instances						 = 0;
		float**			raw_arrays_data_ptr				 = NULL;
		unsigned int*   raw_arrays_data_size_ptr		 = NULL;
		unsigned int	rendertarget_height				 = 0;
		unsigned int	rendertarget_width				 = 0;
		float**			unordered_arrays_data_ptr		 = NULL;
		unsigned int*   unordered_arrays_data_size_ptr   = NULL;
		unsigned char** unordered_elements_data_ptr		 = NULL;
		unsigned int*   unordered_elements_data_size_ptr = NULL;

		if (!is_instanced)
		{
			/* Non-instanced case */
			n_instances						 = 1;
			raw_arrays_data_ptr				 = &m_raw_array_noninstanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_noninstanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_noninstanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_noninstanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_noninstanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_noninstanced_data_size;
		}
		else
		{
			/* Instanced case */
			n_instances						 = getAmountOfDrawInstances();
			raw_arrays_data_ptr				 = &m_raw_array_instanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_instanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_instanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_instanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_instanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_instanced_data_size;
		}

		getRenderTargetSize(n_instances, &rendertarget_width, &rendertarget_height);

		/* Store full-screen quad coordinates that will be used for actual array data generation. */
		float dx = 2.0f / float(rendertarget_width);
		float dy = 2.0f / float(rendertarget_height);

		/* Generate raw vertex array data */
		unsigned int single_rt_height = 0;
		unsigned int single_rt_width  = 0;
		unsigned int whole_rt_width   = 0;
		unsigned int whole_rt_height  = 0;

		*raw_arrays_data_size_ptr =
			static_cast<unsigned int>(getAmountOfVerticesPerInstance() * 4 /* components */ * sizeof(float));
		*raw_arrays_data_ptr = new float[*raw_arrays_data_size_ptr / sizeof(float)];

		getRenderTargetSize(1, &single_rt_width, &single_rt_height);
		getRenderTargetSize(getAmountOfDrawInstances(), &whole_rt_width, &whole_rt_height);

		/* Generate the general coordinates storage first.
		 *
		 * For non-instanced draw calls, we only need to draw a single instance, hence we are free
		 * to use screen-space coordinates.
		 * For instanced draw calls, we'll have the vertex shader add gl_InstanceID-specific deltas
		 * to make sure the vertices are laid out correctly, so map <-1, 1> range to <0, screen_space_height_of_single_instance>
		 */
		std::vector<tcu::Vec4> data_coordinates;
		float				   dx_multiplier = 0.0f;
		float				   dy_multiplier = 0.0f;
		float				   end_y		 = 0.0f;
		float				   mid_y		 = 0.0f;
		float				   start_y		 = 0.0f;

		if (is_instanced)
		{
			start_y = -1.0f;
			end_y   = start_y + float(single_rt_height) / float(whole_rt_height) * 2.0f;
			mid_y   = start_y + (end_y - start_y) * 0.5f;
		}
		else
		{
			end_y   = 1.0f;
			mid_y   = 0.0f;
			start_y = -1.0f;
		}

		if (output_type == SHADER_OUTPUT_TYPE_POINTS)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}
		else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}

		/* W stores information whether given vertex is the middle vertex */
		data_coordinates.push_back(tcu::Vec4(0, mid_y, 0, 1));						  /* Middle vertex */
		data_coordinates.push_back(tcu::Vec4(-1 + dx * dx_multiplier, mid_y, 0, 0));  /* Left vertex */
		data_coordinates.push_back(tcu::Vec4(0, start_y + dy * dy_multiplier, 0, 0)); /* Top vertex */
		data_coordinates.push_back(tcu::Vec4(1 - dx * dx_multiplier, mid_y, 0, 0));   /* Right vertex */
		data_coordinates.push_back(tcu::Vec4(0, end_y - dy * dy_multiplier, 0, 0));   /* Bottom vertex */

		/* Now that we have the general storage ready, we can generate raw array data for specific draw
		 * call that this specific test instance will be verifying */
		int	n_raw_array_indices	 = 0;
		int	raw_array_indices[24]   = { -1 }; /* 12 is a max for all supported input geometry */
		float* raw_array_traveller_ptr = *raw_arrays_data_ptr;

		for (unsigned int n = 0; n < sizeof(raw_array_indices) / sizeof(raw_array_indices[0]); ++n)
		{
			raw_array_indices[n] = -1;
		}

		switch (m_drawcall_mode)
		{
		case GL_TRIANGLES:
		{
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;

			/* ACD triangle */
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 3;

			/* ADE triangle */
			raw_array_indices[6] = 0;
			raw_array_indices[7] = 3;
			raw_array_indices[8] = 4;

			/* AEB triangle */
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 1;

			n_raw_array_indices = 12;

			break;
		} /* case GL_TRIANGLES: */

		case GL_TRIANGLES_ADJACENCY_EXT:
		{
			/* Note: Geometry shader used by this test does not rely on adjacency data
			 *       so we will fill corresponding indices with meaningless information
			 *       (always first vertex data) */
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 1;
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 0;

			/* ACD triangle */
			raw_array_indices[6]  = 0;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 2;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 3;
			raw_array_indices[11] = 0;

			/* ADE triangle */
			raw_array_indices[12] = 0;
			raw_array_indices[13] = 0;
			raw_array_indices[14] = 3;
			raw_array_indices[15] = 0;
			raw_array_indices[16] = 4;
			raw_array_indices[17] = 0;

			/* AEB triangle */
			raw_array_indices[18] = 0;
			raw_array_indices[19] = 0;
			raw_array_indices[20] = 4;
			raw_array_indices[21] = 0;
			raw_array_indices[22] = 1;
			raw_array_indices[23] = 0;

			n_raw_array_indices = 24;

			break;
		} /* case GL_TRIANGLES_ADJACENCY_EXT:*/

		case GL_TRIANGLE_FAN:
		{
			/* ABCDEB */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 4;
			raw_array_indices[5] = 1;

			n_raw_array_indices = 6;

			break;
		} /* case GL_TRIANGLE_FAN: */

		case GL_TRIANGLE_STRIP:
		{
			/* BACDAEB.
			 *
			 * Note that this will generate a degenerate triangle (ACD & CDA) but that's fine
			 * since we only sample triangle centroids in this test.
			 */
			raw_array_indices[0] = 1;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 0;
			raw_array_indices[5] = 4;
			raw_array_indices[6] = 1;

			n_raw_array_indices = 7;

			break;
		} /* case GL_TRIANGLE_STRIP: */

		case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
		{
			/* Order as in GL_TRIANGLE_STRIP case. Adjacency data not needed for the test,
			 * hence any data can be used.
			 */
			raw_array_indices[0]  = 1;
			raw_array_indices[1]  = 0;
			raw_array_indices[2]  = 0;
			raw_array_indices[3]  = 0;
			raw_array_indices[4]  = 2;
			raw_array_indices[5]  = 0;
			raw_array_indices[6]  = 3;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 0;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 0;
			raw_array_indices[12] = 1;
			raw_array_indices[13] = 0;

			n_raw_array_indices = 14;
			break;
		} /* case GL_TRIANGLE_STRIP_ADJACENCY_EXT: */

		default:
		{
			TCU_FAIL("Unsupported draw call mode");
		}
		} /* switch (m_drawcall_mode) */

		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			if (raw_array_indices[index] != -1)
			{
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].x();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].y();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].z();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].w();
				raw_array_traveller_ptr++;
			}
		}

		/* Generate unordered data:
		 *
		 * Store vertices in reversed order and configure indices so that the pipeline receives
		 * vertex data in original order */
		*unordered_arrays_data_size_ptr   = *raw_arrays_data_size_ptr;
		*unordered_arrays_data_ptr		  = new float[*unordered_arrays_data_size_ptr];
		*unordered_elements_data_size_ptr = static_cast<unsigned int>(n_raw_array_indices * sizeof(unsigned char));
		*unordered_elements_data_ptr	  = new unsigned char[*unordered_elements_data_size_ptr];

		/* Set unordered array data first */
		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			memcpy(*unordered_arrays_data_ptr + 4 /* components */ * (n_raw_array_indices - 1 - index),
				   *raw_arrays_data_ptr + 4 /* components */ * index, sizeof(float) * 4 /* components */);
		}

		/* Followed by index data */
		for (int n = 0; n < n_raw_array_indices; ++n)
		{
			(*unordered_elements_data_ptr)[n] = (unsigned char)(n_raw_array_indices - 1 - n);
		}
	} /* for (both cases) */
}